

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_filelength(char *args)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *__s;
  
  __s = args;
  if (*args == '\"') {
    __s = args + 1;
    sVar1 = strlen(__s);
    args[sVar1] = '\0';
  }
  lVar2 = PHYSFS_openRead(__s);
  if (lVar2 == 0) {
    uVar4 = PHYSFS_getLastError();
    printf("failed to open. Reason: [%s].\n",uVar4);
  }
  else {
    uVar3 = PHYSFS_fileLength(lVar2);
    if (uVar3 == 0xffffffffffffffff) {
      uVar4 = PHYSFS_getLastError();
      printf("failed to determine length. Reason: [%s].\n",uVar4);
    }
    else {
      printf(" (cast to int) %d bytes.\n",uVar3 & 0xffffffff);
    }
    PHYSFS_close(lVar2);
  }
  return 1;
}

Assistant:

static int cmd_filelength(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        PHYSFS_sint64 len = PHYSFS_fileLength(f);
        if (len == -1)
            printf("failed to determine length. Reason: [%s].\n", PHYSFS_getLastError());
        else
            printf(" (cast to int) %d bytes.\n", (int) len);

        PHYSFS_close(f);
    } /* else */

    return 1;
}